

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O2

double GetCostStat(uint litlen,uint dist,void *context)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  
  if (dist == 0) {
    dVar5 = *(double *)((long)context + (ulong)litlen * 8 + 0xa00);
  }
  else {
    iVar1 = *(int *)(ZopfliGetLengthSymbol_table + (long)(int)litlen * 4);
    iVar3 = ZopfliGetDistSymbol(dist);
    uVar2 = 0x1f;
    if (dist - 1 != 0) {
      for (; dist - 1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    iVar4 = 0;
    if (4 < (int)dist) {
      iVar4 = (uVar2 ^ 0xffffffe0) + 0x1f;
    }
    dVar5 = (double)(iVar4 + *(int *)(ZopfliGetLengthExtraBits_table + (long)(int)litlen * 4)) +
            *(double *)((long)context + (long)iVar1 * 8 + 0xa00) +
            *(double *)((long)context + (long)iVar3 * 8 + 0x1300);
  }
  return dVar5;
}

Assistant:

static double GetCostStat(unsigned litlen, unsigned dist, void* context) {
  SymbolStats* stats = (SymbolStats*)context;
  if (dist == 0) {
    return stats->ll_symbols[litlen];
  } else {
    int lsym = ZopfliGetLengthSymbol(litlen);
    int lbits = ZopfliGetLengthExtraBits(litlen);
    int dsym = ZopfliGetDistSymbol(dist);
    int dbits = ZopfliGetDistExtraBits(dist);
    return lbits + dbits + stats->ll_symbols[lsym] + stats->d_symbols[dsym];
  }
}